

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,string *predictedClassOutputName,
          string *classProbabilityOutputName,string *description)

{
  element_type *peVar1;
  TreeEnsembleClassifier *pTVar2;
  ModelDescription *pMVar3;
  Model local_40;
  string *local_28;
  string *description_local;
  string *classProbabilityOutputName_local;
  string *predictedClassOutputName_local;
  TreeEnsembleClassifier *this_local;
  
  local_28 = description;
  description_local = classProbabilityOutputName;
  classProbabilityOutputName_local = predictedClassOutputName;
  predictedClassOutputName_local = (string *)this;
  Model::Model(&local_40,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&local_40,true);
  Model::~Model(&local_40);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleClassifier_00576338;
  peVar1 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  pTVar2 = Specification::Model::mutable_treeensembleclassifier(peVar1);
  this->tree_classifier_parameters = pTVar2;
  peVar1 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  pMVar3 = Specification::Model::mutable_description(peVar1);
  Specification::ModelDescription::set_predictedfeaturename(pMVar3,classProbabilityOutputName_local)
  ;
  peVar1 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  pMVar3 = Specification::Model::mutable_description(peVar1);
  Specification::ModelDescription::set_predictedprobabilitiesname(pMVar3,description_local);
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier
    (const std::string& predictedClassOutputName,
     const std::string& classProbabilityOutputName,
     const std::string& description)
    : TreeEnsembleBase(Model(description), true /* isClassifier */),
      tree_classifier_parameters(m_spec->mutable_treeensembleclassifier())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedClassOutputName);
        m_spec->mutable_description()->set_predictedprobabilitiesname(classProbabilityOutputName);
    }